

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtCompoundCollisionAlgorithm::removeChildAlgorithms(cbtCompoundCollisionAlgorithm *this)

{
  uint uVar1;
  cbtCollisionAlgorithm *pcVar2;
  cbtDispatcher *pcVar3;
  ulong uVar4;
  
  uVar1 = (this->m_childCollisionAlgorithms).m_size;
  for (uVar4 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar4; uVar4 = uVar4 + 1) {
    pcVar2 = (this->m_childCollisionAlgorithms).m_data[uVar4];
    if (pcVar2 != (cbtCollisionAlgorithm *)0x0) {
      (**pcVar2->_vptr_cbtCollisionAlgorithm)();
      pcVar3 = (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
               m_dispatcher;
      (*pcVar3->_vptr_cbtDispatcher[0xf])(pcVar3,(this->m_childCollisionAlgorithms).m_data[uVar4]);
    }
  }
  return;
}

Assistant:

void cbtCompoundCollisionAlgorithm::removeChildAlgorithms()
{
	int numChildren = m_childCollisionAlgorithms.size();
	int i;
	for (i = 0; i < numChildren; i++)
	{
		if (m_childCollisionAlgorithms[i])
		{
			m_childCollisionAlgorithms[i]->~cbtCollisionAlgorithm();
			m_dispatcher->freeCollisionAlgorithm(m_childCollisionAlgorithms[i]);
		}
	}
}